

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall Sudoku::collectSolutionHints(Sudoku *this,string *filename)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double local_70;
  FieldVector testFields;
  string local_48 [32];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"collect solution hints");
  std::endl<char,std::char_traits<char>>(poVar4);
  testFields.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testFields.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  testFields.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  createFieldCopy(this,&testFields);
  lVar8 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)testFields.
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)testFields.
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1) {
    bVar2 = Field::fixed(*(Field **)
                          ((long)&((testFields.
                                    super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                          lVar8));
    if (!bVar2) {
      Field::resetTriedValues
                (*(Field **)
                  ((long)&((testFields.
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar8));
    }
    lVar8 = lVar8 + 0x10;
  }
  std::__cxx11::string::string(local_48,(string *)filename);
  (*this->_vptr_Sudoku[2])(this,1,&testFields,1,local_48);
  std::__cxx11::string::~string(local_48);
  poVar4 = std::operator<<((ostream *)&std::cout,"average number of possibilities from ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
  poVar4 = std::operator<<(poVar4," runs: ");
  std::endl<char,std::char_traits<char>>(poVar4);
  plVar6 = (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  plVar1 = (this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_70 = 0.0;
  for (; plVar6 != plVar1; plVar6 = plVar6 + 1) {
    lVar8 = *plVar6;
    dVar9 = round((double)lVar8 / (double)this->nRuns_);
    poVar4 = std::ostream::_M_insert<double>(dVar9);
    std::operator<<(poVar4," ");
    local_70 = local_70 + (double)lVar8 / (double)this->nRuns_;
  }
  lVar8 = (long)(this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->nPossibilities_).super__Vector_base<long_long,_std::allocator<long_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar4," total average: ");
  lVar7 = lVar8 >> 3;
  auVar10._8_4_ = (int)(lVar8 >> 0x23);
  auVar10._0_8_ = lVar7;
  auVar10._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (local_70 /
                      ((auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4," nfixed: ");
  iVar3 = nFixed(this);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::~vector
            (&testFields);
  return;
}

Assistant:

void Sudoku::collectSolutionHints(std::string filename)
{
  //std::cout<<"Press Enter . . . "<<std::endl;
  //std::cin.get();
  std::cout<<"collect solution hints"<<std::endl;

  FieldVector testFields;   // testFields is created as copy of fields_ the first time fixSomeFieldsToGetASolvableSudoku is called

  createFieldCopy(testFields);

  const int numberRuns = 1;
  for(int n = 0; n < numberRuns; n++)
  {
    // clear tried values
    for(int i = 0; i < testFields.size(); i++)
    {
      if(!testFields[i]->fixed())
        testFields[i]->resetTriedValues();
    }

    bool createSolutionHints = (n == numberRuns-1);
    fixSomeFieldsToGetASolvableSudoku(createSolutionHints, testFields, true, filename);
  }

  int i=0;
  std::cout<<"average number of possibilities from "<<numberRuns<<" runs: "<<std::endl;
  double average = 0.0;
  for(long long value : nPossibilities_)
  {
    std::cout<<round((double)value/nRuns_)<<" ";
    average += (double)value/nRuns_;
    i++;
  }
  average /= nPossibilities_.size();

  std::cout<<std::endl<<" total average: "<<average<<std::endl
    <<" nfixed: "<<nFixed()<<std::endl;
}